

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

void Buffer_To_Window(FIELD *field,WINDOW_conflict *win)

{
  int iVar1;
  char *pcVar2;
  int local_38;
  int local_34;
  char *local_30;
  char *pBuffer;
  int row;
  int len;
  int height;
  int width;
  WINDOW_conflict *win_local;
  FIELD *field_local;
  
  if ((win != (WINDOW_conflict *)0x0) && (field != (FIELD *)0x0)) {
    if (win == (WINDOW_conflict *)0x0) {
      local_34 = -1;
      local_38 = -1;
    }
    else {
      local_34 = win->_maxy + 1;
      local_38 = win->_maxx + 1;
    }
    pBuffer._0_4_ = 0;
    local_30 = field->buf;
    for (; (int)pBuffer < local_34; pBuffer._0_4_ = (int)pBuffer + 1) {
      pcVar2 = After_End_Of_Data(local_30,local_38);
      iVar1 = (int)pcVar2 - (int)local_30;
      if (0 < iVar1) {
        wmove(win,(int)pBuffer,0);
        waddnstr(win,local_30,iVar1);
      }
      local_30 = local_30 + local_38;
    }
    return;
  }
  __assert_fail("win && field",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/form/frm_driver.c"
                ,0x160,"void Buffer_To_Window(const FIELD *, WINDOW *)");
}

Assistant:

static void Buffer_To_Window(const FIELD  * field, WINDOW * win)
{
  int width, height;
  int len;
  int row;
  char *pBuffer;

  assert(win && field);

  getmaxyx(win, height, width);

  for(row=0, pBuffer=field->buf; 
      row < height; 
      row++, pBuffer += width )
    {
      if ((len = (int)( After_End_Of_Data( pBuffer, width ) - pBuffer )) > 0)
        {
          wmove( win, row, 0 );
          waddnstr( win, pBuffer, len );
        }
    }   
}